

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestresendRequestSetString::RunImpl(TestresendRequestSetString *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  BeginSeqNo *actual;
  TestDetails **ppTVar3;
  EndSeqNo *actual_00;
  TestDetails local_2d0;
  int local_2ac [9];
  TestDetails local_288;
  int local_264;
  undefined1 local_260 [8];
  EndSeqNo endSeqNo;
  BeginSeqNo beginSeqNo;
  allocator<char> local_189;
  string local_188;
  undefined1 local_168 [8];
  ResendRequest object;
  TestresendRequestSetString *this_local;
  
  object.super_Message._336_8_ = this;
  FIX42::ResendRequest::ResendRequest((ResendRequest *)local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"8=FIX.4.2\x019=16\x0135=2\x017=1\x0116=233\x0110=184\x01",
             &local_189);
  FIX::Message::setString((Message *)local_168,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  FIX::BeginSeqNo::BeginSeqNo
            ((BeginSeqNo *)&endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum);
  FIX::EndSeqNo::EndSeqNo((EndSeqNo *)local_260);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_264 = 1;
  actual = FIX42::ResendRequest::get
                     ((ResendRequest *)local_168,
                      (BeginSeqNo *)&endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum
                     );
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_288,*ppTVar3,0x2bf);
  UnitTest::CheckEqual<int,FIX::BeginSeqNo>(pTVar1,&local_264,actual,&local_288);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2ac[0] = 0xe9;
  actual_00 = FIX42::ResendRequest::get((ResendRequest *)local_168,(EndSeqNo *)local_260);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_2d0,*ppTVar3,0x2c0);
  UnitTest::CheckEqual<int,FIX::EndSeqNo>(pTVar1,local_2ac,actual_00,&local_2d0);
  FIX::EndSeqNo::~EndSeqNo((EndSeqNo *)local_260);
  FIX::BeginSeqNo::~BeginSeqNo
            ((BeginSeqNo *)&endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum);
  FIX42::ResendRequest::~ResendRequest((ResendRequest *)local_168);
  return;
}

Assistant:

TEST(resendRequestSetString)
{
  ResendRequest object;

  object.setString
    ( "8=FIX.4.2\0019=16\00135=2\0017=1\00116=233\00110=184\001" );

  BeginSeqNo beginSeqNo;
  EndSeqNo endSeqNo;
  CHECK_EQUAL( 1, object.get( beginSeqNo ) );
  CHECK_EQUAL( 233, object.get( endSeqNo ) );
}